

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

void __thiscall
CTcParser::parse_obj_prop
          (CTcParser *this,int *err,CTPNObjDef *objdef,int replace,CTcSymMetaclass *meta_sym,
          tcprs_term_info *term_info,propset_def *propset_stack,int propset_depth,int obj_is_nested,
          int is_inline)

{
  undefined1 *puVar1;
  ushort prop;
  CTPNObjProp *pCVar2;
  int *piVar3;
  tcprs_term_info *ptVar4;
  byte bVar5;
  wchar_t wVar6;
  tc_toktyp_t tVar7;
  int iVar8;
  CTcToken *pCVar9;
  size_t sVar10;
  CTcSymProp *pCVar11;
  CTcSymProp *prop_sym;
  CTPNAnonFunc *inline_method_00;
  CTcPrsNodeBase code_body;
  CTcSymMetaProp *pCVar12;
  CTcDictPropEntry *pCVar13;
  CTcPrsNodeBase *pCVar14;
  undefined **expr_00;
  uint is_static;
  CTcSymMetaclass *cur_meta;
  byte *pbVar15;
  byte *p;
  CTcSymObjBase *this_00;
  CTcSymMetaclass *pCVar16;
  byte *__n;
  propset_def *ppVar17;
  ulong uVar18;
  byte *__dest;
  size_t sVar19;
  bool bVar20;
  CTPNObjProp *new_prop;
  CTcPrsNode *expr;
  int op_args;
  CTPNAnonFunc *inline_method;
  CTcToken prop_tok;
  int has_retval;
  int varargs_list;
  char tmpbuf [80];
  char expbuf [80];
  CTPNObjProp *local_168;
  CTcPrsNodeBase *local_160;
  int local_154;
  size_t local_150;
  CTPNAnonFunc *local_148;
  int *local_140;
  CTcToken local_138;
  tcprs_term_info *local_110;
  byte *local_108;
  CTcParser *local_100;
  CTcSymMetaclass *local_f8;
  int local_f0;
  int local_ec;
  CTcPrsNodeBase local_e8 [10];
  CTcPrsPropExprSave local_98;
  
  local_168 = (CTPNObjProp *)0x0;
  local_140 = err;
  local_110 = term_info;
  pCVar9 = CTcTokenizer::copycur(G_tok);
  local_138.typ_ = pCVar9->typ_;
  local_138._4_4_ = *(undefined4 *)&pCVar9->field_0x4;
  local_138.text_ = pCVar9->text_;
  local_138.text_len_ = pCVar9->text_len_;
  local_138.int_val_._0_4_ = (undefined4)pCVar9->int_val_;
  local_138.int_val_._4_4_ = *(undefined4 *)((long)&pCVar9->int_val_ + 4);
  local_138._32_8_ = *(undefined8 *)&pCVar9->field_0x20;
  local_f8 = meta_sym;
  if (propset_depth != 0) {
    if (local_138.typ_ == TOKT_OPERATOR) {
      CTcTokenizer::log_error(0x2bd6);
    }
    sVar19 = (G_tok->curtok_).text_len_;
    local_100 = this;
    memcpy(&local_98,(G_tok->curtok_).text_,sVar19);
    if (0 < propset_depth) {
      uVar18 = 10;
      if (propset_depth < 10) {
        uVar18 = (ulong)(uint)propset_depth;
      }
      ppVar17 = propset_stack + uVar18;
      do {
        __n = (byte *)ppVar17[-1].prop_pattern_len;
        ppVar17 = ppVar17 + -1;
        pbVar15 = __n + sVar19;
        if (pbVar15 < (byte *)0x51) {
          p = (byte *)ppVar17->prop_pattern;
          bVar20 = __n == (byte *)0x0;
          local_150 = sVar19;
          local_108 = pbVar15;
          if (bVar20) {
            pCVar14 = local_e8;
          }
          else {
            wVar6 = utf8_ptr::s_getch((char *)p);
            pCVar14 = local_e8;
            while (wVar6 != L'*') {
              wVar6 = utf8_ptr::s_getch((char *)p);
              sVar10 = utf8_ptr::s_putch((char *)pCVar14,wVar6);
              pCVar14 = (CTcPrsNodeBase *)((long)&pCVar14->_vptr_CTcPrsNodeBase + sVar10);
              pbVar15 = p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1;
              __n = p + ((long)__n - (long)pbVar15);
              bVar20 = __n == (byte *)0x0;
              p = pbVar15;
              if (bVar20) goto LAB_00209f2d;
              wVar6 = utf8_ptr::s_getch((char *)pbVar15);
            }
            if ((!bVar20) && (wVar6 = utf8_ptr::s_getch((char *)p), wVar6 == L'*')) {
              __n = p + ((long)__n -
                        (long)(p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1));
              p = p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1;
            }
          }
LAB_00209f2d:
          sVar19 = local_150;
          memcpy(pCVar14,&local_98,local_150);
          __dest = (byte *)((long)&pCVar14->_vptr_CTcPrsNodeBase + sVar19);
          if (__n != (byte *)0x0) {
            memcpy(__dest,p,(size_t)__n);
            __dest = __dest + (long)__n;
          }
          pbVar15 = local_108;
          sVar19 = (long)__dest - (long)local_e8;
          memcpy(&local_98,local_e8,sVar19);
        }
        else {
          CTcTokenizer::log_error(0x2bb8);
        }
      } while ((pbVar15 < (byte *)0x51) &&
              (iVar8 = (int)uVar18, uVar18 = (ulong)(iVar8 - 1), 1 < iVar8));
    }
    local_138.text_ = CTcTokenizer::store_source(G_tok,(char *)&local_98,sVar19);
    this = local_100;
    local_138.text_len_ = sVar19;
  }
  local_154 = 0;
  if (local_138.typ_ == TOKT_OPERATOR) {
    parse_op_name(this,&local_138,&local_154);
  }
  pCVar11 = (CTcSymProp *)
            CTcPrsSymtab::find(this->global_symtab_,local_138.text_,local_138.text_len_,
                               (CTcPrsSymtab **)0x0);
  tVar7 = CTcTokenizer::next(G_tok);
  ptVar4 = local_110;
  if ((int)tVar7 < 0x1a) {
    if ((int)tVar7 < 0x17) {
      if (tVar7 - TOKT_RPAR < 2) {
LAB_0020a09f:
        prop_sym = (CTcSymProp *)0x0;
        CTcTokenizer::log_error
                  (0x2b64,local_138.text_len_ & 0xffffffff,local_138.text_,
                   (ulong)(uint)(G_tok->curtok_).text_len_,(G_tok->curtok_).text_);
        if ((G_tok->curtok_).typ_ == TOKT_SEM) goto LAB_0020a524;
        CTcTokenizer::next(G_tok);
        goto LAB_0020a0e8;
      }
      if (tVar7 != TOKT_LPAR) {
LAB_0020a0f9:
        CTcTokenizer::log_error_curtok(G_tok,0x2b6d);
        goto LAB_0020a10d;
      }
    }
    else if (tVar7 != TOKT_LBRACE) {
      if (tVar7 != TOKT_RBRACE) goto LAB_0020a0f9;
      goto LAB_0020a09f;
    }
LAB_0020a13a:
    prop_sym = look_up_prop(this,&local_138,1);
    if ((prop_sym != (CTcSymProp *)0x0) && (((prop_sym->super_CTcSymPropBase).field_0x2a & 2) != 0))
    {
      CTcTokenizer::log_error_curtok(G_tok,0x2b7b);
    }
    piVar3 = local_140;
    if (is_inline == 0) {
      expr_00 = (undefined **)0x1;
      code_body._vptr_CTcPrsNodeBase =
           (_func_int **)
           parse_code_body(this,0,1,1,(int *)local_e8,(int *)&local_160,(int *)&local_148,&local_ec,
                           (CTcSymLocal **)&local_98,&local_f0,local_140,(CTcPrsSymtab *)0x0,
                           TCPRS_CB_NORMAL,propset_stack,propset_depth,(CTcCodeBodyRef *)0x0,
                           (CTcFormalTypeList **)0x0);
      if (*piVar3 != 0) {
        return;
      }
      if (local_154 != 0) {
        if ((CTPNCodeBody *)code_body._vptr_CTcPrsNodeBase != (CTPNCodeBody *)0x0) {
          puVar1 = &(((CTPNCodeBody *)code_body._vptr_CTcPrsNodeBase)->super_CTPNCodeBodyBase).
                    field_0xb9;
          *puVar1 = *puVar1 | 2;
        }
        if (((int)local_148 != 0) || ((int)local_e8[0]._vptr_CTcPrsNodeBase != local_154 + -1)) {
          CTcTokenizer::log_error(0x2bd9,(ulong)(local_154 - 1));
        }
      }
      if (prop_sym == (CTcSymProp *)0x0) goto LAB_0020a524;
LAB_0020a515:
      local_168 = CTPNObjDef::add_method
                            (objdef,prop_sym,(CTPNCodeBody *)code_body._vptr_CTcPrsNodeBase,
                             (CTcPrsNode *)expr_00,replace);
      goto LAB_0020a524;
    }
    CTcTokenizer::unget(G_tok);
    inline_method_00 = CTcPrsOpUnary::parse_anon_func(0,1);
    if (inline_method_00 == (CTPNAnonFunc *)0x0) goto LAB_0020a524;
    pCVar14 = (CTcPrsNodeBase *)0x0;
  }
  else {
    if (0x28 < (int)tVar7) {
      if (tVar7 != TOKT_COLON) {
        if (tVar7 != TOKT_SEM) goto LAB_0020a0f9;
        goto LAB_0020a09f;
      }
      if ((pCVar11 != (CTcSymProp *)0x0) &&
         (*(int *)&((CVmHashEntry *)
                   &(pCVar11->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase)->field_0x24
          == 2)) {
        CTcMain::log_error(G_tcmain,local_110->desc_,local_110->linenum_,TC_SEV_ERROR,0x2baf);
        CTcTokenizer::unget(G_tok);
        ptVar4->unterm_ = 1;
        return;
      }
      CTcTokenizer::next(G_tok);
      iVar8 = (*objdef->_vptr_CTPNObjDef[1])
                        (objdef,&local_168,local_140,local_110,&local_138,(ulong)(uint)replace);
      if (iVar8 == 0) {
        return;
      }
LAB_0020a0e8:
      prop_sym = (CTcSymProp *)0x0;
      goto LAB_0020a524;
    }
    if (tVar7 == TOKT_RBRACK) goto LAB_0020a09f;
    if (tVar7 != TOKT_EQ) goto LAB_0020a0f9;
    CTcTokenizer::next(G_tok);
    if ((G_tok->curtok_).typ_ == TOKT_LBRACE) {
      CTcTokenizer::log_error(0x2b20);
      goto LAB_0020a13a;
    }
LAB_0020a10d:
    pCVar9 = &local_138;
    prop_sym = look_up_prop(this,pCVar9,1);
    if (prop_sym == (CTcSymProp *)0x0) {
      bVar5 = 0;
    }
    else {
      bVar5 = ((prop_sym->super_CTcSymPropBase).field_0x2a & 2) >> 1;
    }
    local_e8[0]._vptr_CTcPrsNodeBase = (_func_int **)0x0;
    local_160 = (CTcPrsNodeBase *)0x0;
    local_148 = (CTPNAnonFunc *)0x0;
    if (bVar5 == 0) {
LAB_0020a3c0:
      bVar20 = (G_tok->curtok_).typ_ == TOKT_STATIC;
      if (bVar20) {
        CTcTokenizer::next(G_tok);
      }
      is_static = (uint)bVar20;
      begin_prop_expr(this,&local_98,is_static,is_inline);
      local_160 = &parse_expr_or_dstr(this,1)->super_CTcPrsNodeBase;
      if (local_160 == (CTcPrsNodeBase *)0x0) {
        *local_140 = 1;
        return;
      }
      expr_00 = (undefined **)local_e8;
      finish_prop_expr(this,&local_98,(CTcPrsNode **)&local_160,(CTPNCodeBody **)expr_00,&local_148,
                       (uint)bVar20,is_inline,prop_sym);
    }
    else {
      if ((G_tok->curtok_).typ_ != TOKT_SSTR) {
        if (bVar5 != 0) {
          CTcTokenizer::log_error_curtok(G_tok,0x2b7b);
        }
        goto LAB_0020a3c0;
      }
      local_160 = (CTcPrsNodeBase *)
                  CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x30,(size_t)pCVar9);
      *(undefined4 *)&((CTcPrsNodeBase *)&local_160[1]._vptr_CTcPrsNodeBase)->_vptr_CTcPrsNodeBase =
           10;
      *(undefined1 *)&((CTcPrsNodeBase *)&local_160[5]._vptr_CTcPrsNodeBase)->_vptr_CTcPrsNodeBase =
           0;
      expr_00 = &PTR_gen_code_0031c798;
      ((CTcPrsNodeBase *)&local_160->_vptr_CTcPrsNodeBase)->_vptr_CTcPrsNodeBase =
           (_func_int **)&PTR_gen_code_0031c798;
      if (this->dict_cur_ == (CTcDictEntry *)0x0) {
        CTcTokenizer::log_error(0x2b7c);
      }
      if (objdef == (CTPNObjDef *)0x0) {
        this_00 = (CTcSymObjBase *)0x0;
      }
      else {
        this_00 = &objdef->obj_sym_->super_CTcSymObjBase;
      }
      do {
        if (this_00 != (CTcSymObjBase *)0x0) {
          prop = (prop_sym->super_CTcSymPropBase).prop_;
          expr_00 = (undefined **)(ulong)prop;
          CTcSymObjBase::add_vocab_word
                    (this_00,(G_tok->curtok_).text_,(G_tok->curtok_).text_len_,prop);
        }
        tVar7 = CTcTokenizer::next(G_tok);
      } while (tVar7 == TOKT_SSTR);
      is_static = 0;
    }
    if (prop_sym == (CTcSymProp *)0x0) goto LAB_0020a524;
    code_body._vptr_CTcPrsNodeBase = local_e8[0]._vptr_CTcPrsNodeBase;
    if ((CTPNCodeBody *)local_e8[0]._vptr_CTcPrsNodeBase != (CTPNCodeBody *)0x0) goto LAB_0020a515;
    pCVar14 = local_160;
    inline_method_00 = local_148;
    if (local_148 == (CTPNAnonFunc *)0x0) {
      if (local_160 != (CTcPrsNodeBase *)0x0) {
        local_168 = CTPNObjDef::add_prop(objdef,prop_sym,(CTcPrsNode *)local_160,replace,is_static);
      }
      goto LAB_0020a524;
    }
  }
  local_168 = CTPNObjDef::add_inline_method
                        (objdef,prop_sym,inline_method_00,(CTcPrsNode *)pCVar14,replace);
LAB_0020a524:
  if (pCVar11 != (CTcSymProp *)0x0) {
    if ((obj_is_nested == 0) || (pCVar11 != this->lexical_parent_sym_)) {
      for (pCVar2 = (objdef->proplist_).first_; pCVar2 != (CTPNObjProp *)0x0;
          pCVar2 = (pCVar2->super_CTPNObjPropBase).nxt_) {
        if ((pCVar2 != local_168) && ((pCVar2->super_CTPNObjPropBase).prop_sym_ == pCVar11)) {
          if (((pCVar2->super_CTPNObjPropBase).field_0x58 & 2) == 0) goto LAB_0020a53c;
          (*objdef->_vptr_CTPNObjDef[2])();
          break;
        }
      }
    }
    else {
LAB_0020a53c:
      CTcTokenizer::log_error
                (0x2b6c,(ulong)(uint)((CVmHashEntry *)
                                     &(pCVar11->super_CTcSymPropBase).super_CTcSymbol.
                                      super_CTcSymbolBase)->len_,
                 ((CVmHashEntry *)
                 &(pCVar11->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase)->str_);
    }
  }
  pCVar16 = local_f8;
  if (prop_sym != (CTcSymProp *)0x0 && local_f8 != (CTcSymMetaclass *)0x0) {
    do {
      for (pCVar12 = (pCVar16->super_CTcSymMetaclassBase).prop_head_;
          pCVar12 != (CTcSymMetaProp *)0x0; pCVar12 = pCVar12->nxt_) {
        if (pCVar12->prop_ == prop_sym) {
          CTcTokenizer::log_error
                    (0x2d17,(prop_sym->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.
                            super_CVmHashEntryCS.super_CVmHashEntry.len_,
                     (prop_sym->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.
                     super_CVmHashEntryCS.super_CVmHashEntry.str_);
          break;
        }
      }
      pCVar16 = (pCVar16->super_CTcSymMetaclassBase).super_meta_;
    } while (pCVar16 != (CTcSymMetaclass *)0x0);
  }
  if ((prop_sym != (CTcSymProp *)0x0) &&
     (pCVar13 = this->dict_prop_head_,
     pCVar13 != (CTcDictPropEntry *)0x0 && ((prop_sym->super_CTcSymPropBase).field_0x2a & 2) != 0))
  {
    do {
      if (pCVar13->prop_ == prop_sym) {
        pCVar13->field_0x10 = pCVar13->field_0x10 | 1;
        return;
      }
      pCVar13 = pCVar13->nxt_;
    } while (pCVar13 != (CTcDictPropEntry *)0x0);
  }
  return;
}

Assistant:

void CTcParser::parse_obj_prop(
    int *err, CTPNObjDef *objdef, int replace, CTcSymMetaclass *meta_sym,
    tcprs_term_info *term_info, propset_def *propset_stack, int propset_depth,
    int obj_is_nested, int is_inline)
{
    /* we haven't created the new property yet */
    CTPNObjProp *new_prop = 0;

    /* presume it's not a static property definition */
    int is_static = FALSE;
    
    /* remember the property token */
    CTcToken prop_tok = *G_tok->copycur();

    /* 
     *   if we're in a property set, apply the property set pattern to the
     *   property name 
     */
    if (propset_depth != 0)
    {
        /* we can't define operator overloads here */
        if (prop_tok.gettyp() == TOKT_OPERATOR)
            G_tok->log_error(TCERR_OPER_IN_PROPSET);
        
        /*
         *   Build the real property name based on all enclosing propertyset
         *   pattern strings.  Start with the current (innermost) pattern,
         *   then apply the next pattern out, and so on.
         *   
         *   Note that if the current nesting depth is greater than the
         *   maximum nesting depth, ignore the illegally deep levels and
         *   just start with the deepest legal level.  
         */
        int i = propset_depth;
		if (i > (int)MAX_PROPSET_DEPTH)
            i = MAX_PROPSET_DEPTH;
        
        /* start with the current token */
        size_t explen = G_tok->getcur()->get_text_len();
        char expbuf[TOK_SYM_MAX_LEN];
        memcpy(expbuf, G_tok->getcur()->get_text(), explen);
        
        /* iterate through the propertyset stack */
        for (propset_def *cur = &propset_stack[i-1] ; i > 0 ; --i, --cur)
        {
            char tmpbuf[TOK_SYM_MAX_LEN];
            utf8_ptr src;
            utf8_ptr dst;
            size_t rem;

            /* if we'd exceed the maximum token length, stop here */
            if (explen + cur->prop_pattern_len > TOK_SYM_MAX_LEN)
            {
                /* complain about it */
                G_tok->log_error(TCERR_PROPSET_TOK_TOO_LONG);
                
                /* stop the expansion */
                break;
            }
            
            /* copy the pattern up to the '*' */
            for (src.set((char *)cur->prop_pattern),
                 dst.set(tmpbuf), rem = cur->prop_pattern_len ;
                 rem != 0 && src.getch() != '*' ; src.inc(&rem))
            {
                /* copy this character */
                dst.setch(src.getch());
            }
            
            /* if we found a '*', skip it */
            if (rem != 0 && src.getch() == '*')
                src.inc(&rem);
            
            /* insert the expansion from the last round here */
            memcpy(dst.getptr(), expbuf, explen);
            
            /* advance our output pointer */
            dst.set(dst.getptr() + explen);
            
            /* copy the remainder of the pattern string */
            if (rem != 0)
            {
                /* copy the remaining bytes */
                memcpy(dst.getptr(), src.getptr(), rem);

                /* advance the output pointer past the copied bytes */
                dst.set(dst.getptr() + rem);
            }
            
            /* copy the result back to the expansion buffer */
            explen = dst.getptr() - tmpbuf;
            memcpy(expbuf, tmpbuf, explen);
        }

        /* store the new token in tokenizer memory */
        prop_tok.set_text(G_tok->store_source(expbuf, explen), explen);
    }

    /* presume we won't find a valid symbol for the property token */
    CTcSymProp *prop_sym = 0;

    /* presume it's not an operator overload property */
    int op_args = 0;

    /* if this is an 'operator' property, the syntax is special */
    if (prop_tok.gettyp() == TOKT_OPERATOR)
        parse_op_name(&prop_tok, &op_args);

    /* 
     *   look up the property token as a symbol, to see if it's already
     *   defined - we don't want to presume it's a property quite yet, but
     *   we can at least look to see if it's defined as something else 
     */
    CTcSymbol *sym = global_symtab_->find(
        prop_tok.get_text(), prop_tok.get_text_len());

    /* skip it and see what comes next */
    switch (G_tok->next())
    {
    case TOKT_LPAR:
    case TOKT_LBRACE:
    parse_method:
        /* look up the symbol */
        prop_sym = look_up_prop(&prop_tok, TRUE);

        /* vocabulary properties can't be code */
        if (prop_sym != 0 && prop_sym->is_vocab())
            G_tok->log_error_curtok(TCERR_VOCAB_REQ_SSTR);

        /* 
         *   A left paren starts a formal parameter list, a left brace starts
         *   a code body - in either case, we have a method, so parse the
         *   code body.  If we're parsing an inline object definition, parse
         *   it as an anonymous method definition instead.
         */
        if (is_inline)
        {
            /* inline object - parse an anonymous method */
            G_tok->unget();
            CTPNAnonFunc *m = CTcPrsOpUnary::parse_anon_func(FALSE, TRUE);

            /* add this as a property expression */
            if (m != 0)
                new_prop = objdef->add_inline_method(prop_sym, m, 0, replace);
        }
        else
        {
            /* top-level object - parse a code body */
            int argc;
            int opt_argc;
            int varargs;
            int varargs_list;
            CTcSymLocal *varargs_list_local;
            int has_retval;
            CTPNCodeBody *code_body = parse_code_body(
                FALSE, TRUE, TRUE, &argc, &opt_argc, &varargs,
                &varargs_list, &varargs_list_local, &has_retval, err, 0,
                TCPRS_CB_NORMAL, propset_stack, propset_depth, 0, 0);

            /* check for errors in the code body */
            if (*err)
                return;

            /* 
             *   if this is an operator, check arguments, and pick the
             *   correct operator for the number of operands for operators
             *   with multiple operand numbers 
             */
            if (op_args != 0)
            {
                /* mark the code body as an operator overload method */
                if (code_body != 0)
                    code_body->set_operator_overload(TRUE);
                
                /* varargs aren't allowed */
                if (varargs)
                {
                    G_tok->log_error(
                        TCERR_OP_OVERLOAD_WRONG_FORMALS, op_args - 1);
                }
                else if (argc != op_args - 1)
                {
                    /* not a valid combination of operator and arguments */
                    G_tok->log_error(
                        TCERR_OP_OVERLOAD_WRONG_FORMALS, op_args - 1);
                }
            }
            
            /* add the method definition */
            if (prop_sym != 0)
                new_prop = objdef->add_method(prop_sym, code_body, 0, replace);
        }
        break;

    case TOKT_SEM:
    case TOKT_RBRACE:
    case TOKT_RPAR:
    case TOKT_RBRACK:
    case TOKT_COMMA:
        /* log the error */
        G_tok->log_error(TCERR_OBJDEF_REQ_PROPVAL,
                         (int)prop_tok.get_text_len(), prop_tok.get_text(),
                         (int)G_tok->getcur()->get_text_len(),
                         G_tok->getcur()->get_text());

        /* if it's anything other than a semicolon, skip it */
        if (G_tok->cur() != TOKT_SEM)
            G_tok->next();
        break;

    case TOKT_COLON:
        /*
         *   It's a nested object definition.  The value of the property is a
         *   reference to an anonymous object defined in-line after the
         *   colon.  The in-line object definition uses the "braces" version
         *   of the standard syntax: after the colon we have the class list,
         *   an open brace, the property list, and a close brace.
         *   
         *   Note that we hold off defining the property symbol for as long
         *   as possible, since we want to make sure that we don't have a
         *   syntax error where this was intended to be a whole new top-level
         *   object definition, but the terminator was accidentally left off
         *   the previous object.  In this case, the new object definition
         *   would look like a nested object rather than a new top-level
         *   object.  This is probably the case if the symbol before the
         *   colon is already known as an object name.
         */
        {
            /* 
             *   If the symbol before the colon is already known as an object
             *   name, it must be intended as a new object rather than a
             *   nested object, meaning that the terminator is missing from
             *   the previous object definition.  If this is the case, flag
             *   the termination error and proceed to parse the new object
             *   definition.  
             */
            if (sym != 0 && sym->get_type() == TC_SYM_OBJ)
            {
                /* 
                 *   flag the unterminated object error - note that the
                 *   location where termination should have occurred is
                 *   where the caller tells us 
                 */
                G_tcmain->log_error(term_info->desc_, term_info->linenum_,
                                    TC_SEV_ERROR, TCERR_UNTERM_OBJ_DEF);

                /* unget the colon so we can parse the new object def */
                G_tok->unget();

                /* flag the termination error for the caller */
                term_info->unterm_ = TRUE;

                /* we're done */
                return;
            }

            /* skip the colon */
            G_tok->next();

            /* parse the nested object property */
            if (!objdef->parse_nested_obj_prop(
                new_prop, err, term_info, &prop_tok, replace))
                return;
        }
        
        /* done */
        break;

    case TOKT_EQ:
        /* skip the '=' */
        G_tok->next();

        /* 
         *   if a brace follows, this must be using the obsolete TADS 2
         *   notation, in which an equals sign followed a property name even
         *   if a method was being defined; if this is the case, generate an
         *   error, but then proceed to treat what follows as a method 
         */
        if (G_tok->cur() == TOKT_LBRACE)
        {
            /* log the error... */
            G_tok->log_error(TCERR_EQ_WITH_METHOD_OBSOLETE);

            /* ...but then go ahead and parse it as a method anyway */
            goto parse_method;
        }

        /* go parse the value */
        goto parse_value;

    default:
        /* 
         *   an '=' is required after a value property name; log the error
         *   and proceed, assuming that the '=' was left out but that the
         *   property value is otherwise well-formed 
         */
        G_tok->log_error_curtok(TCERR_PROP_REQ_EQ);

    parse_value:
        {
            /* look up the property symbol */
            prop_sym = look_up_prop(&prop_tok, TRUE);

            /* note if it's a vocabulary property */
            int is_vocab_prop = (prop_sym != 0 && prop_sym->is_vocab());

            /* we don't know whether we have a constant or method yet */
            CTPNCodeBody *code_body = 0;
            CTcPrsNode *expr = 0;
            CTPNAnonFunc *inline_method = 0;

            /* 
             *   if this is a vocabulary property, perform special vocabulary
             *   list parsing - a vocabulary property can have one or more
             *   single-quoted strings that we store in a list, but the list
             *   does not have to be enclosed in brackets 
             */
            if (is_vocab_prop && G_tok->cur() == TOKT_SSTR)
            {
                /* 
                 *   set the property to a vocab list placeholder for now in
                 *   the object - we'll replace it during linking with the
                 *   actual vocabulary list
                 */
                CTcConstVal cval;
                cval.set_vocab_list();
                expr = new CTPNConst(&cval);
                
                /* if I have no dictionary, it's an error */
                if (dict_cur_ == 0)
                    G_tok->log_error(TCERR_VOCAB_NO_DICT);
                
                /* get the object symbol */
                CTcSymObj *obj_sym = (objdef != 0 ? objdef->get_obj_sym() : 0);
                
                /* parse the list entries */
                for (;;)
                {
                    /* add the word to our vocabulary list */
                    if (obj_sym != 0)
                        obj_sym->add_vocab_word(
                            G_tok->getcur()->get_text(),
                            G_tok->getcur()->get_text_len(),
                            prop_sym->get_prop());
                    
                    /* 
                     *   skip the string; if another string doesn't
                     *   immediately follow, we're done with the implied list
                     *   
                     */
                    if (G_tok->next() != TOKT_SSTR)
                        break;
                }
            }
            else
            {
                /* if it's a vocabulary property, other types aren't allowed */
                if (is_vocab_prop)
                    G_tok->log_error_curtok(TCERR_VOCAB_REQ_SSTR);
                
                /* check for the 'static' keyword */
                if (G_tok->cur() == TOKT_STATIC)
                {
                    /* note that it's static */
                    is_static = TRUE;

                    /* skip the 'static' keyword */
                    G_tok->next();
                }
                
                /* prepare to parse the property value expression */
                CTcPrsPropExprSave save_info;
                begin_prop_expr(&save_info, is_static, is_inline);
                
                /* 
                 *   parse the expression (which can be a double-quoted
                 *   string instead of a value expression) 
                 */
                expr = parse_expr_or_dstr(TRUE);
                if (expr == 0)
                {
                    *err = TRUE;
                    return;
                }
                
                /* 
                 *   finish the expression, and check to see if it needs
                 *   dynamic evaluation (if so, it will yield a code body)
                 */
                finish_prop_expr(
                    &save_info, expr, code_body, inline_method,
                    is_static, is_inline, prop_sym);
            }

            /* if we have a valid property and expression, add it */
            if (prop_sym != 0)
            {
                /* add the expression or code body, as appropriate */
                if (code_body != 0)
                {
                    /* method */
                    new_prop = objdef->add_method(
                        prop_sym, code_body, expr, replace);
                }
                else if (inline_method != 0)
                {
                    /* inline method */
                    new_prop = objdef->add_inline_method(
                        prop_sym, inline_method, expr, replace);
                }
                else if (expr != 0)
                {
                    /* constant expression */
                    new_prop = objdef->add_prop(
                        prop_sym, expr, replace, is_static);
                }
            }
        }
        
        /* done with the property */
        break;
    }

    /* make sure that the object doesn't already define this propery */
    if (sym != 0)
    {
        /* presume it's not a duplicate */
        int is_dup = FALSE;

        /* 
         *   if the enclosing object is nested, and this is the lexicalParent
         *   property, then it's defined automatically by the compiler and
         *   thus can't be redefined explicitly 
         */
        if (obj_is_nested && sym == lexical_parent_sym_)
            is_dup = TRUE;

        /* if we didn't already find a duplicate, scan the existing list */
        if (!is_dup)
        {
            /* scan the property list for this object */
            for (CTPNObjProp *obj_prop = objdef->get_first_prop() ;
                 obj_prop != 0 ; obj_prop = obj_prop->get_next_prop())
            {
                /* 
                 *   if it matches (and it's not the one we just added), log
                 *   an error 
                 */
                if (obj_prop != new_prop && obj_prop->get_prop_sym() == sym)
                {
                    /* 
                     *   if this property is overwritable, we're allowed to
                     *   replace it with a new value; otherwise, it's an
                     *   illegal duplicate 
                     */
                    if (obj_prop->is_overwritable())
                    {
                        /* 
                         *   we're allowed to overwrite it with an explicit
                         *   redefinition; simply remove the old property
                         *   from the list so we can add the new one 
                         */
                        objdef->delete_property(obj_prop->get_prop_sym());
                    }
                    else
                    {
                        /* note that we found a duplicate property */
                        is_dup = TRUE;
                    }

                    /* no need to continue looking */
                    break;
                }
            }
        }

        /* if we found a duplicate, log an error */
        if (is_dup)
            G_tok->log_error(TCERR_PROP_REDEF_IN_OBJ,
                             (int)sym->get_sym_len(), sym->get_sym());
    }

    /* 
     *   if we're modifying an intrinsic class, make sure the property isn't
     *   defined in the class's native interface 
     */
    if (meta_sym != 0 && prop_sym != 0)
    {
        /* check this intrinsic class and all of its superclasses */
        for (CTcSymMetaclass *cur_meta = meta_sym ; cur_meta != 0 ;
             cur_meta = cur_meta->get_super_meta())
        {
            /* scan the list of native methods */
            for (CTcSymMetaProp *mprop = cur_meta->get_prop_head() ;
                 mprop != 0 ; mprop = mprop->nxt_)
            {
                /* if it matches, flag an error */
                if (mprop->prop_ == prop_sym)
                {
                    /* log the error */
                    G_tok->log_error(TCERR_CANNOT_MOD_META_PROP,
                                     prop_sym->get_sym_len(),
                                     prop_sym->get_sym());
                    
                    /* no need to look any further */
                    break;
                }
            }
        }
    }

    /* 
     *   if this is a dictionary property, note that it's been defined for
     *   this object 
     */
    if (prop_sym != 0 && prop_sym->is_vocab())
    {
        /* scan the list of dictionary properties for this one */
        for (CTcDictPropEntry *entry = dict_prop_head_ ; entry != 0 ;
             entry = entry->nxt_)
        {
            /* check this one for a match */
            if (entry->prop_ == prop_sym)
            {
                /* mark this entry as defined for this object */
                entry->defined_ = TRUE;

                /* no need to look any further */
                break;
            }
        }
    }
}